

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O0

double __thiscall
Knn::computeDis(Knn *this,vector<double,_std::allocator<double>_> *v1,
               vector<double,_std::allocator<double>_> *v2)

{
  double dVar1;
  double di;
  vector<double,_std::allocator<double>_> v;
  vector<double,_std::allocator<double>_> *v2_local;
  vector<double,_std::allocator<double>_> *v1_local;
  Knn *this_local;
  
  v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)v2;
  operator-<double,_double>((vector<double,_std::allocator<double>_> *)&di,v1,v2);
  dVar1 = ::operator*((vector<double,_std::allocator<double>_> *)&di,
                      (vector<double,_std::allocator<double>_> *)&di);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&di);
  return dVar1;
}

Assistant:

double Knn::computeDis(const vector<double>& v1, const vector<double>& v2){
    auto v = v1 - v2;
    double di = v*v;
    return di;
}